

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::UnboundedLiteral>
          (StaticInitializerVisitor *this,UnboundedLiteral *expr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  bool bVar1;
  uint uVar2;
  PortBackref *pPVar3;
  size_type sVar4;
  Expression *pEVar5;
  reference ppFVar6;
  Expression *in_RSI;
  ASTContext *in_RDI;
  size_t i_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_1;
  ArgList formals;
  SubroutineSymbol *sub_1;
  size_t i;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args;
  SystemSubroutine *sub;
  CallExpression *call;
  Diagnostic *diag_1;
  Diagnostic *diag;
  DiagCode code;
  bool isDeclaredBefore;
  bool isFromPort;
  bool hasInit;
  VariableSymbol *var;
  Symbol *sym;
  SubroutineSymbol *in_stack_fffffffffffffea8;
  Diagnostic *in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  size_type sVar7;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 *puVar8;
  DiagCode DVar9;
  undefined4 in_stack_fffffffffffffed0;
  ExpressionKind EVar10;
  SourceLocation in_stack_fffffffffffffed8;
  Expression *pEVar11;
  Expression *__idx;
  DiagCode code_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  size_type local_f8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_f0;
  SystemSubroutine *local_e0;
  CallExpression *local_d8;
  SourceLocation local_d0;
  undefined4 local_c4;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  undefined4 local_8c;
  Diagnostic *local_88;
  SourceLocation local_80;
  undefined4 local_74;
  size_t local_70;
  char *local_68;
  undefined8 local_60;
  undefined8 local_58;
  SourceLocation local_50;
  SourceLocation local_48;
  undefined4 local_3c;
  Diagnostic *local_38;
  undefined4 local_2a;
  undefined1 local_26;
  _Optional_payload_base<bool> local_25;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  VariableSymbol *local_20;
  Symbol *local_18;
  Expression *local_10;
  
  code_00 = in_stack_fffffffffffffee0._M_ptr._4_4_;
  DVar9 = SUB84((ulong)in_stack_fffffffffffffec0 >> 0x20,0);
  EVar10 = in_RSI->kind;
  if (EVar10 - NamedValue < 2) {
    local_10 = in_RSI;
    local_18 = Expression::getSymbolReference
                         ((Expression *)in_stack_fffffffffffffef8._M_extent_value,
                          (bool)in_stack_fffffffffffffef7);
    if (local_18 != (Symbol *)0x0) {
      if (local_18->kind == Variable) {
        local_20 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x10ce9a4);
        if (local_20 != *(VariableSymbol **)&in_RDI->lookupIndex) {
          pEVar11 = ValueSymbol::getInitializer((ValueSymbol *)0x10ce9d1);
          local_21 = pEVar11 != (Expression *)0x0;
          pPVar3 = ValueSymbol::getFirstPortBackref(&local_20->super_ValueSymbol);
          local_22 = pPVar3 != (PortBackref *)0x0;
          local_25 = (_Optional_payload_base<bool>)
                     Symbol::isDeclaredBefore
                               ((Symbol *)in_stack_fffffffffffffed8,
                                (Symbol *)CONCAT44(EVar10,in_stack_fffffffffffffed0));
          local_26 = 0;
          local_23 = std::optional<bool>::value_or<bool>
                               ((optional<bool> *)in_stack_fffffffffffffeb8,
                                (bool *)in_stack_fffffffffffffeb0);
          if ((((local_21 & 1) == 0) || ((local_22 & 1) != 0)) || (!(bool)local_23)) {
            if (((local_21 & 1) == 0) || ((local_22 & 1) != 0)) {
              puVar8 = &slang::diag::StaticInitValue;
            }
            else {
              puVar8 = &slang::diag::StaticInitOrder;
            }
            local_3c = *puVar8;
            local_50 = (local_10->sourceRange).startLoc;
            local_48 = (local_10->sourceRange).endLoc;
            sourceRange.startLoc._4_4_ = EVar10;
            sourceRange.startLoc._0_4_ = in_stack_fffffffffffffed0;
            sourceRange.endLoc = in_stack_fffffffffffffed8;
            local_2a = local_3c;
            local_38 = ASTContext::addDiag(in_RDI,code_00,sourceRange);
            DVar9 = SUB84((ulong)puVar8 >> 0x20,0);
            local_60 = *(undefined8 *)(*(long *)&in_RDI->lookupIndex + 8);
            local_58 = *(undefined8 *)(*(long *)&in_RDI->lookupIndex + 0x10);
            arg._M_str = in_stack_ffffffffffffff00;
            arg._M_len = in_stack_fffffffffffffef8._M_extent_value;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       arg);
            local_70 = (local_20->super_ValueSymbol).super_Symbol.name._M_len;
            local_68 = (local_20->super_ValueSymbol).super_Symbol.name._M_str;
            arg_00._M_str = in_stack_ffffffffffffff00;
            arg_00._M_len = in_stack_fffffffffffffef8._M_extent_value;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       arg_00);
            local_74 = 0x50001;
            local_80 = (local_20->super_ValueSymbol).super_Symbol.location;
            Diagnostic::addNote(in_stack_fffffffffffffeb0,DVar9,in_stack_fffffffffffffeb8);
          }
        }
      }
      else if ((local_18->kind == Net) || (local_18->kind == ModportPort)) {
        local_8c = 0xf80006;
        local_a0 = (local_10->sourceRange).startLoc;
        local_98 = (local_10->sourceRange).endLoc;
        sourceRange_00.startLoc._4_4_ = EVar10;
        sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffed0;
        sourceRange_00.endLoc = in_stack_fffffffffffffed8;
        local_88 = ASTContext::addDiag(in_RDI,code_00,sourceRange_00);
        local_b0 = *(undefined8 *)(*(long *)&in_RDI->lookupIndex + 8);
        local_a8 = *(undefined8 *)(*(long *)&in_RDI->lookupIndex + 0x10);
        arg_01._M_str = in_stack_ffffffffffffff00;
        arg_01._M_len = in_stack_fffffffffffffef8._M_extent_value;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   arg_01);
        local_c0 = (local_18->name)._M_len;
        local_b8 = (local_18->name)._M_str;
        arg_02._M_str = in_stack_ffffffffffffff00;
        arg_02._M_len = in_stack_fffffffffffffef8._M_extent_value;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   arg_02);
        local_c4 = 0x50001;
        local_d0 = local_18->location;
        Diagnostic::addNote(in_stack_fffffffffffffeb0,DVar9,in_stack_fffffffffffffeb8);
      }
    }
  }
  else if (EVar10 == Call) {
    local_d8 = Expression::as<slang::ast::CallExpression>(in_RSI);
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)CONCAT44(EVar10,in_stack_fffffffffffffed0),
               (StaticInitializerVisitor *)in_RDI);
    bVar1 = CallExpression::isSystemCall((CallExpression *)0x10ced26);
    if (bVar1) {
      std::get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                  *)0x10ced40);
      local_e0 = not_null<const_slang::ast::SystemSubroutine_*>::operator*
                           ((not_null<const_slang::ast::SystemSubroutine_*> *)0x10ced48);
      local_f0 = CallExpression::arguments((CallExpression *)0x10ced5a);
      local_f8 = 0;
      while (sVar7 = local_f8,
            sVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                               0x10ced81), sVar7 < sVar4) {
        uVar2 = (*local_e0->_vptr_SystemSubroutine[4])(local_e0,local_f8);
        if ((uVar2 & 1) == 0) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (&local_f0,local_f8);
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    ((Expression *)in_stack_fffffffffffffeb0,
                     (StaticInitializerVisitor *)in_stack_fffffffffffffea8);
        }
        local_f8 = local_f8 + 1;
      }
    }
    else {
      std::get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                  *)0x10cede6);
      SubroutineSymbol::getArguments(in_stack_fffffffffffffea8);
      CallExpression::arguments((CallExpression *)0x10cee0f);
      pEVar11 = (Expression *)0x0;
      while (__idx = pEVar11,
            pEVar5 = (Expression *)
                     std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                               ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *
                                )0x10cee38), pEVar11 < pEVar5) {
        ppFVar6 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
                  operator[]((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                              *)&stack0xfffffffffffffef0,(size_type)__idx);
        if ((*ppFVar6)->direction == In) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     &stack0xfffffffffffffee0,(size_type)__idx);
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (pEVar11,(StaticInitializerVisitor *)in_stack_fffffffffffffea8);
        }
        pEVar11 = (Expression *)((long)&__idx->kind + 1);
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }